

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApproxCheck.cpp
# Opt level: O2

bool __thiscall anon_unknown.dwarf_3697::ApproxCheck::runOnFunction(ApproxCheck *this,Function *F)

{
  Function *pFVar1;
  Instruction *this_00;
  ApproxCheck *this_01;
  Value *a;
  bool bVar2;
  raw_ostream *prVar3;
  char *pcVar4;
  pointer ppVVar5;
  ret_type this_02;
  _Rb_tree_header *p_Var6;
  Function *pFVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  MDNode *this_03;
  MDOperand *Val;
  _Base_ptr p_Var10;
  Instruction *in_RCX;
  pointer ppIVar11;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
  *this_04;
  _Self __tmp;
  pointer ppVVar12;
  Function *this_05;
  Function *pFVar13;
  Function *pFVar14;
  StringRef SVar15;
  StringRef RHS;
  inst_iterator E;
  Instruction *local_78;
  inst_iterator I;
  Instruction local_48 [24];
  
  prVar3 = (raw_ostream *)llvm::errs();
  prVar3 = llvm::raw_ostream::operator<<(prVar3,"\n===================");
  prVar3 = llvm::raw_ostream::operator<<(prVar3,"Function ");
  SVar15 = (StringRef)llvm::Value::getName();
  prVar3 = llvm::raw_ostream::operator<<(prVar3,SVar15);
  llvm::raw_ostream::operator<<(prVar3,"===================\n\n");
  llvm::
  InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
  ::InstIterator<llvm::Function>(&I,F);
  pFVar1 = F + 0x48;
  E.BI.NodePtr = (node_pointer)0x0;
  E.BBs = (SymbolTableList<llvm::BasicBlock> *)pFVar1;
  E.BB.NodePtr = (node_pointer)pFVar1;
  while( true ) {
    bVar2 = llvm::
            InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
            ::operator!=(&I,&E);
    if (!bVar2) break;
    in_RCX = (Instruction *)&I.BI.NodePtr[-2].super_node_base_type.Next;
    if (I.BI.NodePtr == (node_pointer)0x0) {
      in_RCX = (Instruction *)0x0;
    }
    local_78 = in_RCX;
    std::vector<llvm::Instruction*,std::allocator<llvm::Instruction*>>::
    emplace_back<llvm::Instruction*>
              ((vector<llvm::Instruction*,std::allocator<llvm::Instruction*>> *)&this->worklist,
               &local_78);
    llvm::
    InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
    ::operator++(&I);
  }
  ppIVar11 = (this->worklist).
             super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  do {
    if (ppIVar11 ==
        (this->worklist).
        super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      for (ppVVar12 = (this->addrList).
                      super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
          ppVVar5 = (this->addrList).
                    super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>._M_impl.
                    super__Vector_impl_data._M_finish, ppVVar12 < ppVVar5; ppVVar12 = ppVVar12 + 1)
      {
        prVar3 = (raw_ostream *)llvm::errs();
        prVar3 = llvm::operator<<(prVar3,*ppVVar12);
        llvm::raw_ostream::operator<<(prVar3,"\n");
      }
      for (ppVVar12 = (this->addrList).
                      super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>._M_impl.
                      super__Vector_impl_data._M_start; ppVVar12 < ppVVar5; ppVVar12 = ppVVar12 + 1)
      {
        this_01 = (ApproxCheck *)*ppVVar12;
        useAsData(this,(Value *)this_01,1);
        std::__cxx11::string::string<std::allocator<char>>((string *)&I,"",(allocator<char> *)&E);
        bVar2 = llvm::isa_impl_cl<llvm::Instruction,_const_llvm::Value_*>::doit((Value *)this_01);
        if (bVar2) {
          this_02 = llvm::dyn_cast<llvm::Instruction,llvm::Value>((Value *)this_01);
          llvm::Instruction::getOpcodeName(this_02);
          std::__cxx11::string::assign((char *)&I);
        }
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&I,"alloca");
        if (bVar2) {
          for (ppIVar11 = (this->worklist).
                          super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              ppIVar11 !=
              (this->worklist).
              super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_finish; ppIVar11 = ppIVar11 + 1) {
            a = (Value *)*ppIVar11;
            bVar2 = hasSameOperands(this_01,a,(Value *)0x0,SUB81(in_RCX,0));
            if (bVar2) {
              useAsData(this,a,1);
            }
          }
        }
        std::__cxx11::string::~string((string *)&I);
        ppVVar5 = (this->addrList).super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      this_04 = &this->opCounter;
      p_Var6 = &(this->opCounter)._M_t._M_impl.super__Rb_tree_header;
      for (pFVar13 = F + 0x50; pFVar13 = *(Function **)pFVar13, pFVar13 != pFVar1;
          pFVar13 = pFVar13 + 8) {
        pFVar7 = pFVar13 + -0x18;
        if (pFVar13 == (Function *)0x0) {
          pFVar7 = (Function *)0x0;
        }
        for (pFVar14 = pFVar7 + 0x30; pFVar14 = *(Function **)pFVar14, pFVar14 != pFVar7 + 0x28;
            pFVar14 = pFVar14 + 8) {
          this_05 = pFVar14 + -0x18;
          if (pFVar14 == (Function *)0x0) {
            this_05 = (Function *)0x0;
          }
          pcVar4 = llvm::Instruction::getOpcodeName((Instruction *)this_05);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&I,pcVar4,(allocator<char> *)&E);
          iVar8 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
                  ::find(&this_04->_M_t,(key_type *)&I);
          std::__cxx11::string::~string((string *)&I);
          if ((_Rb_tree_header *)iVar8._M_node == p_Var6) {
            pcVar4 = llvm::Instruction::getOpcodeName((Instruction *)this_05);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&I,pcVar4,(allocator<char> *)&E);
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
                     ::operator[](this_04,(key_type *)&I);
            pmVar9->first = 1;
            std::__cxx11::string::~string((string *)&I);
            pcVar4 = llvm::Instruction::getOpcodeName((Instruction *)this_05);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&I,pcVar4,(allocator<char> *)&E);
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
                     ::operator[](this_04,(key_type *)&I);
            pmVar9->second = 0;
          }
          else {
            pcVar4 = llvm::Instruction::getOpcodeName((Instruction *)this_05);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&I,pcVar4,(allocator<char> *)&E);
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
                     ::operator[](this_04,(key_type *)&I);
            pmVar9->first = pmVar9->first + 1;
          }
          std::__cxx11::string::~string((string *)&I);
          E.BBs = (SymbolTableList<llvm::BasicBlock> *)0x0;
          E.BB.NodePtr = (node_pointer)0x0;
          SVar15.Length = 6;
          SVar15.Data = "approx";
          this_03 = llvm::Instruction::getMetadata((Instruction *)this_05,SVar15);
          if (this_03 == (MDNode *)0x0) {
            E.BB.NodePtr = (node_pointer)0x0;
            E.BBs = (SymbolTableList<llvm::BasicBlock> *)"";
          }
          else {
            Val = llvm::MDNode::getOperand(this_03,0);
            llvm::cast<llvm::MDString,llvm::MDOperand>(Val);
            E._0_16_ = llvm::MDString::getString();
          }
          RHS.Length = 2;
          RHS.Data = "no";
          bVar2 = llvm::StringRef::equals((StringRef *)&E,RHS);
          if (!bVar2) {
            pcVar4 = llvm::Instruction::getOpcodeName((Instruction *)this_05);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&I,pcVar4,(allocator<char> *)&local_78);
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
                     ::operator[](this_04,(key_type *)&I);
            pmVar9->second = pmVar9->second + 1;
            std::__cxx11::string::~string((string *)&I);
          }
        }
      }
      p_Var10 = (this->opCounter)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while( true ) {
        prVar3 = (raw_ostream *)llvm::errs();
        if ((_Rb_tree_header *)p_Var10 == p_Var6) break;
        prVar3 = llvm::raw_ostream::operator<<(prVar3,(string *)(p_Var10 + 1));
        prVar3 = llvm::raw_ostream::operator<<(prVar3,": ");
        prVar3 = llvm::raw_ostream::operator<<(prVar3,*(int *)&p_Var10[2].field_0x4);
        prVar3 = llvm::raw_ostream::operator<<(prVar3,"/");
        prVar3 = llvm::raw_ostream::operator<<(prVar3,p_Var10[2]._M_color);
        llvm::raw_ostream::operator<<(prVar3," can be approximated\n");
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      }
      llvm::raw_ostream::operator<<(prVar3,"\n");
      ppIVar11 = (this->worklist).
                 super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if ((this->worklist).
          super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppIVar11) {
        (this->worklist).
        super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppIVar11;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
      ::clear(&this_04->_M_t);
      ppVVar12 = (this->addrList).super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if ((this->addrList).super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>._M_impl
          .super__Vector_impl_data._M_finish != ppVVar12) {
        (this->addrList).super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppVVar12;
      }
      return false;
    }
    this_00 = *ppIVar11;
    pcVar4 = llvm::Instruction::getOpcodeName(this_00);
    std::__cxx11::string::string<std::allocator<char>>((string *)&I,pcVar4,(allocator<char> *)&E);
    bVar2 = llvm::Instruction::mayReadOrWriteMemory(this_00);
    if (bVar2) {
LAB_00105bbf:
      E.BBs = (SymbolTableList<llvm::BasicBlock> *)0x0;
      E.BB.NodePtr = (node_pointer)0x0;
      E.BI.NodePtr = (node_pointer)0x0;
      std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::vector
                ((vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> *)local_48,
                 (vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> *)&E);
      in_RCX = local_48;
      checkUseChain(this,this_00,1,
                    (vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> *)local_48);
      std::_Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::~_Vector_base
                ((_Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> *)local_48
                );
      std::_Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::~_Vector_base
                ((_Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> *)&E);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &I,"br");
      if (bVar2) goto LAB_00105bbf;
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &I,"ret");
      if (bVar2) goto LAB_00105bbf;
    }
    std::__cxx11::string::~string((string *)&I);
    ppIVar11 = ppIVar11 + 1;
  } while( true );
}

Assistant:

virtual bool runOnFunction(Function &F) {
			errs() << "\n===================" << "Function " << F.getName() << "===================\n\n";

			for (inst_iterator I = inst_begin(F), E = inst_end(F); I != E; ++I) {
				worklist.push_back(&*I);
			}

			// Step 1) Find all places where an address is being used.
			// Step 2) If the address is stored in memory, locate the addresses that point to those memory locations.
			for(std::vector<Instruction*>::iterator i = worklist.begin(); i != worklist.end(); i++) {
				Instruction* instr = *i;
				std::string opcode = instr->getOpcodeName();
				if (instr->mayReadOrWriteMemory() || opcode == "br" || opcode == "ret") {
					// errs() << "(0)" << *instr << "\n";
					std::vector<Instruction*> history;
					checkUseChain(instr, 1, history);
				}
			}

			for (std::vector<Value*>::iterator i = addrList.begin(); i < addrList.end(); i++) {
				errs() << **i << "\n";
			}

			// Step 3) Find all places where the address is being operated on.
			for (std::vector<Value*>::iterator i = addrList.begin(); i < addrList.end(); i++) {
				Value* v = *i;
				useAsData(v, 1);

				// alloca is a special case. We do not want to let it check against all local variables of the same type.
				std::string newopcode = "";
				if (isa<Instruction>(v)) {
					Instruction *I = dyn_cast<Instruction>(v);
					newopcode = I->getOpcodeName();
				}

				if (newopcode != "alloca") {
					for(std::vector<Instruction*>::iterator i = worklist.begin(); i != worklist.end(); i++) {
						Value* instr = *i;
						if (hasSameOperands(v, instr, false)) {
							// errs() << "(0)" << *instr << "\n";
							useAsData(instr, 1);
						}
					}
				}
			}

			countOpcodes(F);

			// Print approx counts
			std::map <std::string, std::pair<int, int>>::iterator i = opCounter.begin();
			while (i != opCounter.end()) {
				errs() << i->first << ": " << i->second.second << "/" << i->second.first << " can be approximated\n";
				i++;
			}
			errs() << "\n";


			worklist.clear();
			opCounter.clear();
			addrList.clear();
			return false;
		}